

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::session_stats_header_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,session_stats_header_alert *this)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 *puVar6;
  bool bVar7;
  ulong uVar8;
  __normal_iterator<libtorrent::stats_metric_*,_std::vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_>_>
  __i;
  undefined8 *puVar9;
  vector<libtorrent::stats_metric,_std::allocator<libtorrent::stats_metric>_> stats;
  undefined8 *local_40;
  undefined8 *local_38;
  long local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"session stats header: ","");
  session_stats_metrics();
  if (local_40 != local_38) {
    uVar8 = (long)local_38 - (long)local_40 >> 4;
    lVar5 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::stats_metric*,std::vector<libtorrent::stats_metric,std::allocator<libtorrent::stats_metric>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::session_stats_header_alert::message[abi:cxx11]()const::__0>>
              (local_40,local_38,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)local_38 - (long)local_40 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::stats_metric*,std::vector<libtorrent::stats_metric,std::allocator<libtorrent::stats_metric>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::session_stats_header_alert::message[abi:cxx11]()const::__0>>
                (local_40,local_38);
    }
    else {
      puVar9 = local_40 + 0x20;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::stats_metric*,std::vector<libtorrent::stats_metric,std::allocator<libtorrent::stats_metric>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::session_stats_header_alert::message[abi:cxx11]()const::__0>>
                (local_40,puVar9);
      for (; puVar9 != local_38; puVar9 = puVar9 + 2) {
        uVar4 = *puVar9;
        iVar2 = *(int *)(puVar9 + 1);
        uVar3 = *(undefined4 *)((long)puVar9 + 0xc);
        iVar1 = *(int *)(puVar9 + -1);
        puVar6 = puVar9;
        while (iVar2 < iVar1) {
          *puVar6 = puVar6[-2];
          puVar6[1] = puVar6[-1];
          iVar1 = *(int *)(puVar6 + -3);
          puVar6 = puVar6 + -2;
        }
        *puVar6 = uVar4;
        *(int *)(puVar6 + 1) = iVar2;
        *(undefined4 *)((long)puVar6 + 0xc) = uVar3;
      }
    }
  }
  if (local_40 != local_38) {
    bVar7 = true;
    puVar9 = local_40;
    do {
      if (!bVar7) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      puVar9 = puVar9 + 2;
      bVar7 = false;
    } while (puVar9 != local_38);
  }
  if (local_40 != (undefined8 *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string session_stats_header_alert::message() const
	{
		std::string stats_header = "session stats header: ";
		std::vector<stats_metric> stats = session_stats_metrics();
		std::sort(stats.begin(), stats.end()
			, [] (stats_metric const& lhs, stats_metric const& rhs)
			{ return lhs.value_index < rhs.value_index; });
		bool first = true;
		for (auto const& s : stats)
		{
			if (!first) stats_header += ", ";
			stats_header += s.name;
			first = false;
		}

		return stats_header;
	}